

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::update_tracker_timer(torrent *this,time_point32 now)

{
  protocol_version idx_00;
  byte bVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  reference paVar8;
  reference ptVar9;
  const_iterator ppVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  value_type *this_00;
  undefined8 uVar13;
  undefined8 uVar14;
  session_settings *psVar15;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  *ptVar16;
  ulong uVar17;
  uint uVar18;
  endpoint *ep;
  bool local_2c1;
  enable_shared_from_this<libtorrent::aux::torrent> local_198;
  time_point local_188;
  uint local_17c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_178;
  rep_conflict local_170;
  int local_16c;
  duration<int,_std::ratio<60L,_1L>_> local_168;
  duration local_164;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_160;
  byte local_15c;
  byte local_15b;
  _Type local_15a;
  bool none_eligible;
  bool before_now;
  iterator iStack_158;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  local_150;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_144;
  undefined1 local_140 [4];
  time_point32 next_tracker_announce;
  value_type *a;
  value_type *state;
  protocol_version ih;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<libtorrent::protocol_version> *__range4;
  timer_state *ep_state;
  timer_state *local_e0;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  local_d8;
  timer_state *local_d0;
  timer_state *local_c8;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  local_c0;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  local_b8;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
  aep_state_iter;
  announce_endpoint *aep;
  const_iterator __end3;
  const_iterator __begin3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range3;
  announce_entry *t;
  iterator __end2;
  iterator __begin2;
  tracker_list *__range2;
  uint local_5c;
  undefined1 local_58 [4];
  int idx;
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  listen_socket_states;
  time_point32 next_announce;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  torrent *this_local;
  time_point32 now_local;
  
  this_local._4_4_ = now.__d.__r;
  if (((byte)this->field_0x5c0 >> 6 & 1) == 0) {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** update tracker timer: not announcing");
  }
  else {
    listen_socket_states.
    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ =
         info_hash_t::has_v1(&this->m_info_hash);
    listen_socket_states.
    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ =
         info_hash_t::has_v2(&this->m_info_hash);
    container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>::
    container_wrapper((container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                       *)((long)&listen_socket_states.
                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                      (array<const_bool,_2UL> *)
                      ((long)&listen_socket_states.
                              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    listen_socket_states.
    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         ::std::chrono::
         time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
         ::max();
    ::std::
    vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
    ::vector((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
              *)local_58);
    local_5c = 0xffffffff;
    uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar6 & 1) != 0) {
      psVar15 = settings(this);
      bVar4 = session_settings::get_bool(psVar15,0x8011);
      psVar15 = settings(this);
      bVar5 = session_settings::get_bool(psVar15,0x8012);
      sVar7 = tracker_list::size(&this->m_trackers);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,
                 "*** update_tracker_timer: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
                 ,(ulong)bVar4,(ulong)bVar5,sVar7 & 0xffffffff);
    }
    tracker_list::begin((tracker_list *)&__end2);
    tracker_list::end((tracker_list *)&t);
    while (bVar4 = boost::intrusive::operator!=
                             (&__end2,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                       *)&t), bVar4) {
      paVar8 = boost::intrusive::
               list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
               ::operator*(&__end2);
      local_5c = local_5c + 1;
      __end3 = ::std::
               vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
               ::begin(&paVar8->endpoints);
      aep = (announce_endpoint *)
            ::std::
            vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
            ::end(&paVar8->endpoints);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                         *)&aep), bVar4) {
        aep_state_iter._M_current =
             (timer_state *)
             __gnu_cxx::
             __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
             ::operator*(&__end3);
        local_c0._M_current =
             (timer_state *)
             ::std::
             vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
             ::begin((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                      *)local_58);
        local_c8 = (timer_state *)
                   ::std::
                   vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ::end((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                          *)local_58);
        local_d0 = aep_state_iter._M_current;
        local_b8 = ::std::
                   find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state*,std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>>,libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::__1>
                             (local_c0,(__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                                        )local_c8,aep_state_iter._M_current);
        local_d8._M_current =
             (timer_state *)
             ::std::
             vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
             ::end((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    *)local_58);
        bVar4 = __gnu_cxx::operator==(&local_b8,&local_d8);
        if (bVar4) {
          ::std::
          vector<libtorrent::aux::(anonymous_namespace)::timer_state,std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>
          ::emplace_back<libtorrent::aux::listen_socket_handle_const&>
                    ((vector<libtorrent::aux::(anonymous_namespace)::timer_state,std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>
                      *)local_58,
                     (listen_socket_handle *)
                     (aep_state_iter._M_current[5].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                      ._M_elems + 1));
          ep_state = (timer_state *)
                     ::std::
                     vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ::end((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                            *)local_58);
          local_e0 = (timer_state *)
                     __gnu_cxx::
                     __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                     ::operator-((__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                                  *)&ep_state,1);
          local_b8 = (__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                      )local_e0;
        }
        ptVar9 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                 ::operator*(&local_b8);
        if ((aep_state_iter._M_current[5].state.
             super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>._M_elems
             [0].tier & 1) != 0) {
          __end4 = ::std::initializer_list<libtorrent::protocol_version>::begin
                             ((initializer_list<libtorrent::protocol_version> *)
                              libtorrent::(anonymous_namespace)::all_versions);
          ppVar10 = ::std::initializer_list<libtorrent::protocol_version>::end
                              ((initializer_list<libtorrent::protocol_version> *)
                               libtorrent::(anonymous_namespace)::all_versions);
          for (; __end4 != ppVar10; __end4 = __end4 + 1) {
            idx_00 = *__end4;
            pvVar11 = container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                      ::operator[]((container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                                    *)((long)&listen_socket_states.
                                              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 6
                                      ),idx_00);
            if ((*pvVar11 & 1U) != 0) {
              pvVar12 = container_wrapper<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_libtorrent::protocol_version,_std::array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>_>
                        ::operator[](&ptVar9->state,idx_00);
              this_00 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                        ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                      *)(aep_state_iter._M_current + 1),idx_00);
              if ((pvVar12->done & 1U) == 0) {
                uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
                if ((uVar6 & 1) != 0) {
                  print_endpoint_abi_cxx11_((string *)local_140,(aux *)aep_state_iter._M_current,ep)
                  ;
                  uVar13 = ::std::__cxx11::string::c_str();
                  uVar14 = ::std::__cxx11::string::c_str();
                  bVar4 = pvVar12->found_working;
                  bVar1 = paVar8->tier;
                  iVar3 = pvVar12->tier;
                  bVar5 = announce_infohash::is_working(this_00);
                  (*(this->super_request_callback)._vptr_request_callback[7])
                            (this,
                             "*** tracker: (%d) [ep: %s ] \"%s\" [ found: %d i->tier: %d tier: %d working: %d fails: %d limit: %d upd: %d ]"
                             ,(ulong)local_5c,uVar13,uVar14,(ulong)(bVar4 & 1),(uint)bVar1,iVar3,
                             (uint)bVar5,(uint)((byte)*(undefined2 *)&this_00->field_0x44 & 0x7f),
                             (uint)paVar8->fail_limit,
                             (uint)((byte)(*(ushort *)&this_00->field_0x44 >> 7) & 1));
                  ::std::__cxx11::string::~string((string *)local_140);
                }
                psVar15 = settings(this);
                bVar4 = session_settings::get_bool(psVar15,0x8011);
                if (bVar4) {
                  psVar15 = settings(this);
                  bVar4 = session_settings::get_bool(psVar15,0x8012);
                  if ((((!bVar4) && ((pvVar12->found_working & 1U) != 0)) &&
                      ((int)(uint)paVar8->tier <= pvVar12->tier)) && (pvVar12->tier != 0x7fffffff))
                  goto LAB_0067a5f5;
                }
                if (pvVar12->tier < (int)(uint)paVar8->tier) {
                  psVar15 = settings(this);
                  bVar4 = session_settings::get_bool(psVar15,0x8011);
                  if (!bVar4) break;
                  pvVar12->found_working = false;
                }
                pvVar12->tier = (uint)paVar8->tier;
                if ((((byte)*(undefined2 *)&this_00->field_0x44 & 0x7f) < paVar8->fail_limit) ||
                   (paVar8->fail_limit == '\0')) {
                  if ((*(ushort *)&this_00->field_0x44 >> 7 & 1) == 0) {
                    ptVar16 = ::std::
                              max<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>>
                                        (&this_00->next_announce,&this_00->min_announce);
                    local_144.__d.__r = (duration)(ptVar16->__d).__r;
                    bVar4 = ::std::chrono::operator<
                                      (&local_144,
                                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                                        *)&listen_socket_states.
                                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (bVar4) {
                      listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_144.__d.__r;
                    }
                  }
                  else {
                    pvVar12->found_working = true;
                  }
                  bVar4 = announce_infohash::is_working(this_00);
                  if (bVar4) {
                    pvVar12->found_working = true;
                  }
                  if ((pvVar12->found_working & 1U) != 0) {
                    psVar15 = settings(this);
                    bVar4 = session_settings::get_bool(psVar15,0x8012);
                    if (!bVar4) {
                      psVar15 = settings(this);
                      bVar4 = session_settings::get_bool(psVar15,0x8011);
                      if (!bVar4) {
                        pvVar12->done = true;
                      }
                    }
                  }
                }
              }
            }
LAB_0067a5f5:
          }
        }
        __gnu_cxx::
        __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
        ::operator++(&__end3);
      }
      local_150._M_current =
           (timer_state *)
           ::std::
           vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
           ::begin((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    *)local_58);
      iStack_158 = ::std::
                   vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ::end((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                          *)local_58);
      local_15a[0] = listen_socket_states.
                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
      local_15a[1] = listen_socket_states.
                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
      bVar4 = ::std::
              all_of<__gnu_cxx::__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state*,std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>>,libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::__2>
                        (local_150,
                         (__normal_iterator<libtorrent::aux::(anonymous_namespace)::timer_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>_>
                          )iStack_158._M_current,
                         (anon_class_2_1_d2284f93)
                         listen_socket_states.
                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
      if (bVar4) break;
      boost::intrusive::
      list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
      ::operator++(&__end2);
    }
    local_15b = 0;
    local_15c = 0;
    bVar4 = ::std::chrono::operator<=
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                        *)&listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                        *)((long)&this_local + 4));
    if (bVar4) {
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = this_local._4_4_;
      local_15b = 1;
    }
    else {
      local_160 = ::std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                  ::max();
      bVar4 = ::std::chrono::operator==
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                          *)&listen_socket_states.
                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
      if (bVar4) {
        local_16c = 1;
        ::std::chrono::duration<int,std::ratio<60l,1l>>::duration<int,void>
                  ((duration<int,std::ratio<60l,1l>> *)&local_168,&local_16c);
        local_164.__r =
             (rep_conflict)
             ::std::chrono::operator+
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                         *)((long)&this_local + 4),&local_168);
        local_15c = 1;
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
              )local_164.__r;
      }
    }
    uVar6 = (uint)local_15b;
    uVar18 = (uint)local_15c;
    cVar2 = this->m_waiting_tracker;
    local_170 = (rep_conflict)
                ::std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                            *)&listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                            *)((long)&this_local + 4));
    uVar17 = total_seconds<std::chrono::duration<int,std::ratio<1l,1l>>>
                       ((duration<int,_std::ratio<1L,_1L>_>)local_170);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "*** update tracker timer: before_now: %d none_eligible: %d m_waiting_tracker: %d next_announce_in: %d"
               ,(ulong)(uVar6 & 1),(ulong)(uVar18 & 1),(ulong)(uint)(int)cVar2,uVar17 & 0xffffffff);
    local_2c1 = false;
    if (this->m_waiting_tracker != '\0') {
      local_178.__d.__r =
           (duration)
           boost::asio::
           basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ::expiry(&this->m_tracker_timer);
      local_2c1 = ::std::chrono::operator==
                            (&local_178,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                              *)&listen_socket_states.
                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_2c1 == false) {
      ::std::chrono::
      time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
      ::time_point<std::chrono::duration<int,std::ratio<1l,1l>>,void>
                ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  *)&local_188,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                  *)&listen_socket_states.
                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_at(&this->m_tracker_timer,&local_188);
      this->m_waiting_tracker = this->m_waiting_tracker + '\x01';
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_198);
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_wait<libtorrent::aux::torrent::update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)::__0>
                ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->m_tracker_timer,(anon_class_16_1_89917c4a *)&local_198);
      update_tracker_timer(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<1l,1l>>>)
      ::$_0::~__0((__0 *)&local_198);
    }
    local_17c = (uint)(local_2c1 != false);
    ::std::
    vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
    ::~vector((vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
               *)local_58);
  }
  return;
}

Assistant:

void torrent::update_tracker_timer(time_point32 const now)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** update tracker timer: not announcing");
#endif
			return;
		}

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
		{
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 next_announce = time_point32::max();

		std::vector<timer_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** update_tracker_timer: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif
		for (auto const& t : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			for (auto const& aep : t.endpoints)
			{
				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](timer_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				timer_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;
				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto const& a = aep.info_hashes[ih];

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker: (%d) [ep: %s ] \"%s\" ["
							" found: %d i->tier: %d tier: %d"
							" working: %d fails: %d limit: %d upd: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str(), t.url.c_str()
							, state.found_working, t.tier, state.tier, a.is_working()
							, a.fails, t.fail_limit, a.updating);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.found_working
						&& t.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (t.tier > state.tier)
					{
						if (!settings().get_bool(settings_pack::announce_to_all_tiers)) break;
						state.found_working = false;
					}
					state.tier = t.tier;
					if (a.fails >= t.fail_limit && t.fail_limit != 0) continue;
					if (a.updating)
					{
						state.found_working = true;
					}
					else
					{
						time_point32 const next_tracker_announce = std::max(a.next_announce, a.min_announce);
						if (next_tracker_announce < next_announce)
							next_announce = next_tracker_announce;
					}
					if (a.is_working()) state.found_working = true;
					if (state.found_working
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
						state.done = true;
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](timer_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}

#ifndef TORRENT_DISABLE_LOGGING
		bool before_now = false;
		bool none_eligible = false;
#endif
		if (next_announce <= now)
		{
			next_announce = now;
#ifndef TORRENT_DISABLE_LOGGING
			before_now = true;
#endif
		}
		else if (next_announce == time_point32::max())
		{
			// if no tracker can be announced to, check again in a minute
			next_announce = now + minutes32(1);
#ifndef TORRENT_DISABLE_LOGGING
			none_eligible = true;
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** update tracker timer: "
			"before_now: %d "
			"none_eligible: %d "
			"m_waiting_tracker: %d "
			"next_announce_in: %d"
			, before_now
			, none_eligible
			, m_waiting_tracker
			, int(total_seconds(next_announce - now)));
#endif

		// don't re-issue the timer if it's the same expiration time as last time
		// if m_waiting_tracker is 0, expires_at() is undefined
		if (m_waiting_tracker && m_tracker_timer.expiry() == next_announce) return;

		m_tracker_timer.expires_at(next_announce);
		ADD_OUTSTANDING_ASYNC("tracker::on_tracker_announce");
		++m_waiting_tracker;
		m_tracker_timer.async_wait([self = shared_from_this()](error_code const& e)
			{ self->wrap(&torrent::on_tracker_announce, e); });
	}